

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O3

Transform * __thiscall
iDynTree::PrismaticJoint::getTransform
          (PrismaticJoint *this,VectorDynSize *jntPos,LinkIndex p_linkA,LinkIndex p_linkB)

{
  int iVar1;
  undefined4 extraout_var;
  Transform *pTVar2;
  double new_q;
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x16])();
  new_q = (double)iDynTree::VectorDynSize::operator()(jntPos,CONCAT44(extraout_var,iVar1));
  if ((this->q_previous != new_q) || (NAN(this->q_previous) || NAN(new_q))) {
    resetBuffers(this,new_q);
  }
  pTVar2 = &this->link2_X_link1;
  if (this->link1 == p_linkA) {
    pTVar2 = &this->link1_X_link2;
  }
  return pTVar2;
}

Assistant:

const Transform & PrismaticJoint::getTransform(const VectorDynSize& jntPos,
                                              const LinkIndex p_linkA,
                                              const LinkIndex p_linkB) const
{
    const double dist = jntPos(this->getPosCoordsOffset());
    updateBuffers(dist);
    if( p_linkA == link1 )
    {
        assert(p_linkB == link2);
        return this->link1_X_link2;
    }
    else
    {
        assert(p_linkA == link2);
        assert(p_linkB == link1);
        return this->link2_X_link1;
    }
}